

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  ImDrawIdx IVar6;
  uint uVar7;
  int iVar8;
  ImDrawList *pIVar9;
  ImVec2 *pIVar10;
  ImVec4 *pIVar11;
  ImDrawIdx IVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  ImVec2 aIStack_2e0 [2];
  int local_2cc;
  float local_2c8;
  float local_2c4;
  ImVec2 *local_2c0;
  ImVec2 *local_2b8;
  ImVec2 *local_2b0;
  ImVec2 *local_2a8;
  ImVec2 *local_2a0;
  ImVec2 *local_298;
  ImVec2 *local_290;
  float local_284;
  ImVec2 *local_280;
  uint local_278;
  int local_274;
  ImVec2 *local_270;
  ImVec2 *local_268;
  ImVec2 *local_260;
  ImVec2 *local_258;
  float local_250;
  float local_24c;
  int local_248;
  byte local_241;
  uint local_240;
  uint local_23c;
  int local_238;
  int local_234;
  bool local_22d;
  float local_22c;
  ImDrawList *local_228;
  float local_220;
  float local_21c;
  float inv_len_1;
  float d2_3;
  float dy_1;
  float dx_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1f8;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_2;
  ImVec2 *out_vtx_1;
  float dm_in_y;
  float dm_in_x;
  float dm_out_y;
  float dm_out_x;
  float inv_lensq_1;
  float d2_2;
  float dm_y_1;
  float dm_x_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  ImVec2 local_1a0;
  ImVec2 local_198;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  int local_130;
  float local_12c;
  int points_last;
  float half_inner_thickness;
  int i_1;
  int i;
  ImVec2 tex_uv1;
  ImVec2 tex_uv0;
  ImVec4 tex_uvs_1;
  ImVec4 tex_uvs;
  ImVec2 *out_vtx;
  float local_e0;
  float inv_lensq;
  float d2_1;
  float dm_y;
  float dm_x;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  float local_84;
  float local_80;
  float half_draw_size;
  float inv_len;
  float d2;
  float dy;
  float dx;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int local_50;
  int vtx_count;
  int idx_count;
  int iStack_44;
  bool use_texture;
  float fractional_thickness;
  int integer_thickness;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  ImVec2 IStack_30;
  int count;
  ImVec2 opaque_uv;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (1 < points_count) {
    IStack_30 = this->_Data->TexUvWhitePixel;
    local_22c = (float)points_count;
    if (!closed) {
      local_22c = (float)(points_count + -1);
    }
    AA_SIZE = local_22c;
    col_trans._3_1_ = 1.0 < thickness;
    local_228 = this;
    opaque_uv.x = thickness;
    opaque_uv.y._3_1_ = closed;
    if ((this->Flags & 1U) == 0) {
      i1_3 = (int)local_22c * 6;
      i2_3 = (int)local_22c << 2;
      aIStack_2e0[0].x = 2.123522e-39;
      aIStack_2e0[0].y = 0.0;
      PrimReserve(this,i1_3,i2_3);
      for (local_1f8 = 0; local_1f8 < (int)AA_SIZE; local_1f8 = local_1f8 + 1) {
        if (local_1f8 + 1 == points_count) {
          local_2cc = 0;
        }
        else {
          local_2cc = local_1f8 + 1;
        }
        p1._4_4_ = local_2cc;
        p2 = points + local_1f8;
        _dy_1 = points + local_2cc;
        d2_3 = _dy_1->x - p2->x;
        inv_len_1 = _dy_1->y - p2->y;
        local_21c = d2_3 * d2_3 + inv_len_1 * inv_len_1;
        if (0.0 < local_21c) {
          aIStack_2e0[0].x = 2.123893e-39;
          aIStack_2e0[0].y = 0.0;
          local_220 = sqrtf(local_21c);
          local_220 = 1.0 / local_220;
          d2_3 = local_220 * d2_3;
          inv_len_1 = local_220 * inv_len_1;
        }
        fVar14 = opaque_uv.x * 0.5 * d2_3;
        fVar15 = opaque_uv.x * 0.5 * inv_len_1;
        (local_228->_VtxWritePtr->pos).x = p2->x + fVar15;
        (local_228->_VtxWritePtr->pos).y = p2->y - fVar14;
        local_228->_VtxWritePtr->uv = IStack_30;
        local_228->_VtxWritePtr->col = col;
        local_228->_VtxWritePtr[1].pos.x = _dy_1->x + fVar15;
        local_228->_VtxWritePtr[1].pos.y = _dy_1->y - fVar14;
        local_228->_VtxWritePtr[1].uv = IStack_30;
        local_228->_VtxWritePtr[1].col = col;
        local_228->_VtxWritePtr[2].pos.x = _dy_1->x - fVar15;
        local_228->_VtxWritePtr[2].pos.y = _dy_1->y + fVar14;
        local_228->_VtxWritePtr[2].uv = IStack_30;
        local_228->_VtxWritePtr[2].col = col;
        local_228->_VtxWritePtr[3].pos.x = p2->x - fVar15;
        local_228->_VtxWritePtr[3].pos.y = p2->y + fVar14;
        local_228->_VtxWritePtr[3].uv = IStack_30;
        local_228->_VtxWritePtr[3].col = col;
        local_228->_VtxWritePtr = local_228->_VtxWritePtr + 4;
        *local_228->_IdxWritePtr = (ImDrawIdx)local_228->_VtxCurrentIdx;
        local_228->_IdxWritePtr[1] = (short)local_228->_VtxCurrentIdx + 1;
        local_228->_IdxWritePtr[2] = (short)local_228->_VtxCurrentIdx + 2;
        local_228->_IdxWritePtr[3] = (ImDrawIdx)local_228->_VtxCurrentIdx;
        local_228->_IdxWritePtr[4] = (short)local_228->_VtxCurrentIdx + 2;
        local_228->_IdxWritePtr[5] = (short)local_228->_VtxCurrentIdx + 3;
        local_228->_IdxWritePtr = local_228->_IdxWritePtr + 6;
        local_228->_VtxCurrentIdx = local_228->_VtxCurrentIdx + 4;
      }
    }
    else {
      integer_thickness = 0x3f800000;
      fractional_thickness = (float)(col & 0xffffff);
      aIStack_2e0[0].x = 2.115844e-39;
      aIStack_2e0[0].y = 0.0;
      opaque_uv.x = ImMax<float>(thickness,1.0);
      iStack_44 = (int)opaque_uv.x;
      idx_count = (int)(opaque_uv.x - (float)iStack_44);
      local_22d = false;
      if (((local_228->Flags & 2U) != 0) && (local_22d = false, iStack_44 < 0x3f)) {
        local_22d = (float)idx_count <= 1e-05;
      }
      vtx_count._3_1_ = local_22d;
      if (local_22d == false) {
        if ((col_trans._3_1_ & 1) == 0) {
          local_238 = (int)AA_SIZE * 0xc;
        }
        else {
          local_238 = (int)AA_SIZE * 0x12;
        }
        local_234 = local_238;
      }
      else {
        local_234 = (int)AA_SIZE * 6;
      }
      local_50 = local_234;
      if (local_22d == false) {
        if ((col_trans._3_1_ & 1) == 0) {
          local_240 = points_count * 3;
        }
        else {
          local_240 = points_count << 2;
        }
        local_23c = local_240;
      }
      else {
        local_23c = points_count << 1;
      }
      temp_normals._4_4_ = local_23c;
      aIStack_2e0[0].x = 2.116207e-39;
      aIStack_2e0[0].y = 0.0;
      PrimReserve(local_228,local_234,local_23c);
      local_241 = 1;
      if ((vtx_count._3_1_ & 1) == 0) {
        local_241 = col_trans._3_1_ ^ 0xff;
      }
      lVar5 = -((long)(int)(points_count * (((byte)~local_241 & 1) * 2 + 3)) * 8 + 0xfU &
               0xfffffffffffffff0);
      temp_points = (ImVec2 *)((long)aIStack_2e0 + lVar5 + 8);
      _i2 = temp_points + points_count;
      local_248 = points_count;
      for (dx = 0.0; pIVar10 = temp_points, (int)dx < (int)AA_SIZE; dx = (float)((int)dx + 1)) {
        if ((int)dx + 1 == points_count) {
          local_24c = 0.0;
        }
        else {
          local_24c = (float)((int)dx + 1);
        }
        dy = local_24c;
        d2 = points[(int)local_24c].x - points[(int)dx].x;
        inv_len = points[(int)local_24c].y - points[(int)dx].y;
        fVar14 = d2 * d2 + inv_len * inv_len;
        half_draw_size = fVar14;
        if (0.0 < fVar14) {
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170c42;
          local_80 = sqrtf(fVar14);
          local_80 = 1.0 / local_80;
          d2 = local_80 * d2;
          inv_len = local_80 * inv_len;
        }
        temp_points[(int)dx].x = inv_len;
        temp_points[(int)dx].y = -d2;
      }
      if ((opaque_uv.y._3_1_ & 1) == 0) {
        temp_points[points_count + -1] = temp_points[points_count + -2];
      }
      if (((vtx_count._3_1_ & 1) == 0) && ((col_trans._3_1_ & 1) != 0)) {
        local_12c = (opaque_uv.x - 1.0) * 0.5;
        if ((opaque_uv.y._3_1_ & 1) == 0) {
          local_130 = points_count + -1;
          local_284 = 1.0;
          fVar14 = local_12c + 1.0;
          local_2c0 = points;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x171654;
          local_140 = operator*(pIVar10,fVar14);
          pIVar10 = local_2c0;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x17166f;
          local_138 = operator+(pIVar10,&local_140);
          *_i2 = local_138;
          pIVar10 = temp_points;
          fVar14 = local_12c;
          local_2b8 = points;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x1716a1;
          local_150 = operator*(pIVar10,fVar14);
          pIVar10 = local_2b8;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x1716bc;
          local_148 = operator+(pIVar10,&local_150);
          _i2[1] = local_148;
          pIVar10 = temp_points;
          fVar14 = local_12c;
          local_2b0 = points;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x1716ef;
          local_160 = operator*(pIVar10,fVar14);
          pIVar10 = local_2b0;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x17170a;
          local_158 = operator-(pIVar10,&local_160);
          fVar14 = local_284;
          _i2[2] = local_158;
          pIVar10 = temp_points;
          fVar14 = local_12c + fVar14;
          local_2a8 = points;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x171749;
          local_170 = operator*(pIVar10,fVar14);
          pIVar10 = local_2a8;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x171764;
          local_168 = operator-(pIVar10,&local_170);
          fVar14 = local_284;
          _i2[3] = local_168;
          local_2a0 = points + local_130;
          pIVar10 = temp_points + local_130;
          fVar14 = local_12c + fVar14;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x1717b2;
          local_180 = operator*(pIVar10,fVar14);
          pIVar10 = local_2a0;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x1717cd;
          IVar16 = operator+(pIVar10,&local_180);
          fVar14 = local_12c;
          _i2[local_130 << 2] = IVar16;
          local_298 = points + local_130;
          pIVar10 = temp_points + local_130;
          local_178 = IVar16;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x17181b;
          local_190 = operator*(pIVar10,fVar14);
          pIVar10 = local_298;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x171836;
          IVar16 = operator+(pIVar10,&local_190);
          fVar14 = local_12c;
          _i2[(long)(local_130 << 2) + 1] = IVar16;
          local_290 = points + local_130;
          pIVar10 = temp_points + local_130;
          local_188 = IVar16;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x171885;
          local_1a0 = operator*(pIVar10,fVar14);
          pIVar10 = local_290;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x1718a0;
          IVar16 = operator-(pIVar10,&local_1a0);
          _i2[(long)(local_130 << 2) + 2] = IVar16;
          local_280 = points + local_130;
          pIVar10 = temp_points + local_130;
          fVar14 = local_12c + local_284;
          local_198 = IVar16;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x1718fb;
          _i1_2 = operator*(pIVar10,fVar14);
          pIVar10 = local_280;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x171916;
          IVar16 = operator-(pIVar10,(ImVec2 *)&i1_2);
          _i2[local_130 * 4 + 3] = IVar16;
        }
        i2_2 = local_228->_VtxCurrentIdx;
        for (idx2_1 = 0; pIVar9 = local_228, (int)idx2_1 < (int)AA_SIZE; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            local_2c4 = 0.0;
          }
          else {
            local_2c4 = (float)(idx2_1 + 1);
          }
          dm_x_1 = local_2c4;
          if (idx2_1 + 1 == points_count) {
            local_2c8 = (float)local_228->_VtxCurrentIdx;
          }
          else {
            local_2c8 = (float)(i2_2 + 4);
          }
          dm_y_1 = local_2c8;
          fVar14 = (temp_points[(int)idx2_1].x + temp_points[(int)local_2c4].x) * 0.5;
          fVar15 = (temp_points[(int)idx2_1].y + temp_points[(int)local_2c4].y) * 0.5;
          dm_out_x = fVar14 * fVar14 + fVar15 * fVar15;
          if (dm_out_x < 0.5) {
            dm_out_x = 0.5;
          }
          fVar14 = (1.0 / dm_out_x) * fVar14;
          fVar15 = (1.0 / dm_out_x) * fVar15;
          dm_in_x = fVar14 * (local_12c + 1.0);
          dm_in_y = fVar15 * (local_12c + 1.0);
          out_vtx_1._4_4_ = fVar14 * local_12c;
          out_vtx_1._0_4_ = fVar15 * local_12c;
          _idx_count_1 = _i2 + ((int)local_2c4 << 2);
          _idx_count_1->x = points[(int)local_2c4].x + dm_in_x;
          _idx_count_1->y = points[(int)dm_x_1].y + dm_in_y;
          _idx_count_1[1].x = points[(int)dm_x_1].x + out_vtx_1._4_4_;
          _idx_count_1[1].y = points[(int)dm_x_1].y + out_vtx_1._0_4_;
          _idx_count_1[2].x = points[(int)dm_x_1].x - out_vtx_1._4_4_;
          _idx_count_1[2].y = points[(int)dm_x_1].y - out_vtx_1._0_4_;
          _idx_count_1[3].x = points[(int)dm_x_1].x - dm_in_x;
          _idx_count_1[3].y = points[(int)dm_x_1].y - dm_in_y;
          IVar6 = SUB42(dm_y_1,0);
          *pIVar9->_IdxWritePtr = IVar6 + 1;
          pIVar9->_IdxWritePtr[1] = (ImDrawIdx)i2_2 + 1;
          pIVar9->_IdxWritePtr[2] = (ImDrawIdx)i2_2 + 2;
          pIVar9->_IdxWritePtr[3] = (ImDrawIdx)i2_2 + 2;
          pIVar9->_IdxWritePtr[4] = IVar6 + 2;
          pIVar9->_IdxWritePtr[5] = IVar6 + 1;
          pIVar9->_IdxWritePtr[6] = IVar6 + 1;
          pIVar9->_IdxWritePtr[7] = (ImDrawIdx)i2_2 + 1;
          pIVar9->_IdxWritePtr[8] = (ImDrawIdx)i2_2;
          pIVar9->_IdxWritePtr[9] = (ImDrawIdx)i2_2;
          pIVar9->_IdxWritePtr[10] = IVar6;
          pIVar9->_IdxWritePtr[0xb] = IVar6 + 1;
          pIVar9->_IdxWritePtr[0xc] = IVar6 + 2;
          pIVar9->_IdxWritePtr[0xd] = (ImDrawIdx)i2_2 + 2;
          pIVar9->_IdxWritePtr[0xe] = (ImDrawIdx)i2_2 + 3;
          pIVar9->_IdxWritePtr[0xf] = (ImDrawIdx)i2_2 + 3;
          pIVar9->_IdxWritePtr[0x10] = IVar6 + 3;
          pIVar9->_IdxWritePtr[0x11] = IVar6 + 2;
          pIVar9->_IdxWritePtr = pIVar9->_IdxWritePtr + 0x12;
          i2_2 = (int)dm_y_1;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          local_228->_VtxWritePtr->pos = _i2[vtx_count_1 << 2];
          local_228->_VtxWritePtr->uv = IStack_30;
          local_228->_VtxWritePtr->col = (ImU32)fractional_thickness;
          local_228->_VtxWritePtr[1].pos = _i2[vtx_count_1 * 4 + 1];
          local_228->_VtxWritePtr[1].uv = IStack_30;
          local_228->_VtxWritePtr[1].col = col;
          local_228->_VtxWritePtr[2].pos = _i2[vtx_count_1 * 4 + 2];
          local_228->_VtxWritePtr[2].uv = IStack_30;
          local_228->_VtxWritePtr[2].col = col;
          local_228->_VtxWritePtr[3].pos = _i2[vtx_count_1 * 4 + 3];
          local_228->_VtxWritePtr[3].uv = IStack_30;
          local_228->_VtxWritePtr[3].col = (ImU32)fractional_thickness;
          local_228->_VtxWritePtr = local_228->_VtxWritePtr + 4;
        }
      }
      else {
        if ((vtx_count._3_1_ & 1) == 0) {
          local_250 = 1.0;
        }
        else {
          local_250 = opaque_uv.x * 0.5 + 1.0;
        }
        fVar14 = local_250;
        local_84 = local_250;
        if ((opaque_uv.y._3_1_ & 1) == 0) {
          local_270 = points;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170d5d;
          local_94 = operator*(pIVar10,fVar14);
          pIVar10 = local_270;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170d78;
          local_8c = operator+(pIVar10,&local_94);
          *_i2 = local_8c;
          pIVar10 = temp_points;
          fVar14 = local_84;
          local_268 = points;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170da7;
          local_a4 = operator*(pIVar10,fVar14);
          pIVar10 = local_268;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170dc2;
          local_9c = operator-(pIVar10,&local_a4);
          _i2[1] = local_9c;
          fVar14 = local_84;
          local_260 = points + (points_count + -1);
          pIVar10 = temp_points + (points_count + -1);
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170e02;
          local_b4 = operator*(pIVar10,fVar14);
          pIVar10 = local_260;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170e1d;
          IVar16 = operator+(pIVar10,&local_b4);
          fVar14 = local_84;
          _i2[points_count * 2 + -2] = IVar16;
          local_258 = points + (points_count + -1);
          pIVar10 = temp_points + (points_count + -1);
          local_ac = IVar16;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170e69;
          _i1_1 = operator*(pIVar10,fVar14);
          pIVar10 = local_258;
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x170e84;
          IVar16 = operator-(pIVar10,(ImVec2 *)&i1_1);
          _i2[(points_count + -1) * 2 + 1] = IVar16;
          local_bc = IVar16;
        }
        i2_1 = local_228->_VtxCurrentIdx;
        for (idx2 = 0; (int)idx2 < (int)AA_SIZE; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_274 = 0;
          }
          else {
            local_274 = idx2 + 1;
          }
          iVar8 = local_274;
          if (idx2 + 1 == points_count) {
            local_278 = local_228->_VtxCurrentIdx;
          }
          else {
            iVar13 = 3;
            if ((vtx_count._3_1_ & 1) != 0) {
              iVar13 = 2;
            }
            local_278 = i2_1 + iVar13;
          }
          uVar7 = local_278;
          fVar14 = (temp_points[(int)idx2].x + temp_points[local_274].x) * 0.5;
          fVar15 = (temp_points[(int)idx2].y + temp_points[local_274].y) * 0.5;
          local_e0 = fVar14 * fVar14 + fVar15 * fVar15;
          if (local_e0 < 0.5) {
            local_e0 = 0.5;
          }
          fVar14 = local_84 * (1.0 / local_e0) * fVar14;
          fVar15 = local_84 * (1.0 / local_e0) * fVar15;
          pIVar10 = _i2 + (local_274 << 1);
          pIVar10->x = points[local_274].x + fVar14;
          pIVar10->y = points[iVar8].y + fVar15;
          pIVar10[1].x = points[iVar8].x - fVar14;
          pIVar10[1].y = points[iVar8].y - fVar15;
          IVar12 = (ImDrawIdx)uVar7;
          IVar6 = (ImDrawIdx)i2_1;
          if ((vtx_count._3_1_ & 1) == 0) {
            *local_228->_IdxWritePtr = IVar12;
            local_228->_IdxWritePtr[1] = IVar6;
            local_228->_IdxWritePtr[2] = IVar6 + 2;
            local_228->_IdxWritePtr[3] = IVar6 + 2;
            local_228->_IdxWritePtr[4] = IVar12 + 2;
            local_228->_IdxWritePtr[5] = IVar12;
            local_228->_IdxWritePtr[6] = IVar12 + 1;
            local_228->_IdxWritePtr[7] = IVar6 + 1;
            local_228->_IdxWritePtr[8] = IVar6;
            local_228->_IdxWritePtr[9] = IVar6;
            local_228->_IdxWritePtr[10] = IVar12;
            local_228->_IdxWritePtr[0xb] = IVar12 + 1;
            local_228->_IdxWritePtr = local_228->_IdxWritePtr + 0xc;
          }
          else {
            *local_228->_IdxWritePtr = IVar12;
            local_228->_IdxWritePtr[1] = IVar6;
            local_228->_IdxWritePtr[2] = IVar6 + 1;
            local_228->_IdxWritePtr[3] = IVar12 + 1;
            local_228->_IdxWritePtr[4] = IVar6 + 1;
            local_228->_IdxWritePtr[5] = IVar12;
            local_228->_IdxWritePtr = local_228->_IdxWritePtr + 6;
          }
          i2_1 = uVar7;
        }
        if ((vtx_count._3_1_ & 1) == 0) {
          for (points_last = 0; points_last < points_count; points_last = points_last + 1) {
            local_228->_VtxWritePtr->pos = points[points_last];
            local_228->_VtxWritePtr->uv = IStack_30;
            local_228->_VtxWritePtr->col = col;
            local_228->_VtxWritePtr[1].pos = _i2[points_last << 1];
            local_228->_VtxWritePtr[1].uv = IStack_30;
            local_228->_VtxWritePtr[1].col = (ImU32)fractional_thickness;
            local_228->_VtxWritePtr[2].pos = _i2[points_last * 2 + 1];
            local_228->_VtxWritePtr[2].uv = IStack_30;
            local_228->_VtxWritePtr[2].col = (ImU32)fractional_thickness;
            local_228->_VtxWritePtr = local_228->_VtxWritePtr + 3;
          }
        }
        else {
          pIVar11 = local_228->_Data->TexUvLines + iStack_44;
          tex_uvs_1.z = pIVar11->x;
          tex_uvs_1.w = pIVar11->y;
          tex_uvs.x = pIVar11->z;
          tex_uvs.y = pIVar11->w;
          if (((float)idx_count != 0.0) || (NAN((float)idx_count))) {
            pIVar11 = local_228->_Data->TexUvLines + (iStack_44 + 1);
            uVar1 = pIVar11->x;
            uVar3 = pIVar11->y;
            uVar2 = pIVar11->z;
            uVar4 = pIVar11->w;
            tex_uvs_1.w = ((float)uVar3 - tex_uvs_1.w) * (float)idx_count + tex_uvs_1.w;
            tex_uvs_1.z = ((float)uVar1 - tex_uvs_1.z) * (float)idx_count + tex_uvs_1.z;
            tex_uvs.y = ((float)uVar4 - tex_uvs.y) * (float)idx_count + tex_uvs.y;
            tex_uvs.x = ((float)uVar2 - tex_uvs.x) * (float)idx_count + tex_uvs.x;
          }
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x171441;
          ImVec2::ImVec2(&tex_uv1,tex_uvs_1.z,tex_uvs_1.w);
          *(undefined8 *)((long)aIStack_2e0 + lVar5) = 0x17145d;
          ImVec2::ImVec2((ImVec2 *)&i_1,tex_uvs.x,tex_uvs.y);
          for (half_inner_thickness = 0.0; (int)half_inner_thickness < points_count;
              half_inner_thickness = (float)((int)half_inner_thickness + 1)) {
            local_228->_VtxWritePtr->pos = _i2[(int)half_inner_thickness << 1];
            local_228->_VtxWritePtr->uv = tex_uv1;
            local_228->_VtxWritePtr->col = col;
            local_228->_VtxWritePtr[1].pos = _i2[(int)half_inner_thickness * 2 + 1];
            local_228->_VtxWritePtr[1].uv = _i_1;
            local_228->_VtxWritePtr[1].col = col;
            local_228->_VtxWritePtr = local_228->_VtxWritePtr + 2;
          }
        }
      }
      local_228->_VtxCurrentIdx = (temp_normals._4_4_ & 0xffff) + local_228->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > 1.0f);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                if (fractional_thickness != 0.0f)
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}